

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_OES_texture_border_clamp(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_OES_texture_border_clamp != 0) {
    glad_glTexParameterIivOES = (PFNGLTEXPARAMETERIIVOESPROC)(*load)("glTexParameterIivOES");
    glad_glTexParameterIuivOES = (PFNGLTEXPARAMETERIUIVOESPROC)(*load)("glTexParameterIuivOES");
    glad_glGetTexParameterIivOES =
         (PFNGLGETTEXPARAMETERIIVOESPROC)(*load)("glGetTexParameterIivOES");
    glad_glGetTexParameterIuivOES =
         (PFNGLGETTEXPARAMETERIUIVOESPROC)(*load)("glGetTexParameterIuivOES");
    glad_glSamplerParameterIivOES =
         (PFNGLSAMPLERPARAMETERIIVOESPROC)(*load)("glSamplerParameterIivOES");
    glad_glSamplerParameterIuivOES =
         (PFNGLSAMPLERPARAMETERIUIVOESPROC)(*load)("glSamplerParameterIuivOES");
    glad_glGetSamplerParameterIivOES =
         (PFNGLGETSAMPLERPARAMETERIIVOESPROC)(*load)("glGetSamplerParameterIivOES");
    glad_glGetSamplerParameterIuivOES =
         (PFNGLGETSAMPLERPARAMETERIUIVOESPROC)(*load)("glGetSamplerParameterIuivOES");
  }
  return;
}

Assistant:

static void load_GL_OES_texture_border_clamp(GLADloadproc load) {
	if(!GLAD_GL_OES_texture_border_clamp) return;
	glad_glTexParameterIivOES = (PFNGLTEXPARAMETERIIVOESPROC)load("glTexParameterIivOES");
	glad_glTexParameterIuivOES = (PFNGLTEXPARAMETERIUIVOESPROC)load("glTexParameterIuivOES");
	glad_glGetTexParameterIivOES = (PFNGLGETTEXPARAMETERIIVOESPROC)load("glGetTexParameterIivOES");
	glad_glGetTexParameterIuivOES = (PFNGLGETTEXPARAMETERIUIVOESPROC)load("glGetTexParameterIuivOES");
	glad_glSamplerParameterIivOES = (PFNGLSAMPLERPARAMETERIIVOESPROC)load("glSamplerParameterIivOES");
	glad_glSamplerParameterIuivOES = (PFNGLSAMPLERPARAMETERIUIVOESPROC)load("glSamplerParameterIuivOES");
	glad_glGetSamplerParameterIivOES = (PFNGLGETSAMPLERPARAMETERIIVOESPROC)load("glGetSamplerParameterIivOES");
	glad_glGetSamplerParameterIuivOES = (PFNGLGETSAMPLERPARAMETERIUIVOESPROC)load("glGetSamplerParameterIuivOES");
}